

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  model_def_t *mdef_00;
  int iVar1;
  uint32 uVar2;
  segdmp_type_t sVar3;
  cmd_ln_t *pcVar4;
  char *pcVar5;
  long lVar6;
  FILE *pFVar7;
  uint32 *puVar8;
  uint32 *puVar9;
  char **dirs;
  char *ifn;
  ulong uVar10;
  segdmp_type_t *in_R9;
  lexicon_t *plVar11;
  uint32 **in_n_frame;
  uint32 **ppuVar12;
  ulong uVar13;
  segdmp_type_t in_stack_ffffffffffffff48;
  uint32 *n_seg;
  lexicon_t *local_88;
  feat_t *feat;
  model_def_t *mdef;
  lexicon_t *lex;
  uint32 **local_68;
  uint32 local_60;
  undefined4 local_5c;
  char *local_58;
  char *local_50;
  char **local_48;
  int32 *cb2mllr;
  uint32 *ts2cb;
  
  parse_cmd_ln(argc,argv);
  iVar1 = initialize(&lex,&mdef,&feat,&ts2cb,&cb2mllr,in_R9);
  if (iVar1 != 0) goto LAB_001057b7;
  pcVar4 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar4,"-segtype");
  iVar1 = strcmp(pcVar5,"all");
  if (iVar1 == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
            ,0x1ab,"Writing frames to one file\n");
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-segdmpfn");
    pcVar4 = cmd_ln_get();
    sVar3 = 0x11f7cb;
    lVar6 = cmd_ln_int_r(pcVar4,"-stride");
    iVar1 = agg_all_seg(feat,sVar3,pcVar5,(uint32)lVar6);
    if (iVar1 == 0) {
      return 0;
    }
    goto LAB_001057b7;
  }
  if (((*pcVar5 == 's') && (pcVar5[1] == 't')) && (pcVar5[2] == '\0')) {
    pcVar4 = cmd_ln_get();
    lVar6 = cmd_ln_int_r(pcVar4,"-cachesz");
    segdmp_set_bufsz((uint32)lVar6);
    pcVar4 = cmd_ln_get();
    local_48 = cmd_ln_str_list_r(pcVar4,"-segdmpdirs");
    pcVar4 = cmd_ln_get();
    local_50 = cmd_ln_str_r(pcVar4,"-segdmpfn");
    pcVar4 = cmd_ln_get();
    local_58 = cmd_ln_str_r(pcVar4,"-segidxfn");
    local_60 = mdef->n_tied_state;
    local_88 = lex;
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
    pFVar7 = fopen(pcVar5,"r");
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
    if (pFVar7 == (FILE *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
              ,0x12f,"Count file %s not found; creating.\n",pcVar5);
      puVar8 = cnt_st_seg(mdef,local_88);
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
              ,0x132,"Writing %s.\n",pcVar5);
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      pFVar7 = fopen(pcVar5,"w");
      for (uVar10 = 0; uVar10 < mdef->n_tied_state; uVar10 = uVar10 + 1) {
        fprintf(pFVar7,"%u\n",(ulong)puVar8[uVar10]);
      }
LAB_0010594f:
      fclose(pFVar7);
      exit(0);
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
            ,0x13d,"Reading %s\n",pcVar5);
    puVar9 = (uint32 *)
             __ckd_calloc__((ulong)mdef->n_tied_state,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                            ,0x13e);
    puVar8 = puVar9;
    for (uVar10 = 0; uVar10 < mdef->n_tied_state; uVar10 = uVar10 + 1) {
      iVar1 = __isoc99_fscanf(pFVar7,"%u",puVar8);
      if (iVar1 != 1) {
        pcVar4 = cmd_ln_get();
        pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
        lVar6 = 0x142;
LAB_001057ad:
        err_msg_system(ERR_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                       ,lVar6,"Error reading count file %s",pcVar5);
        goto LAB_001057b7;
      }
      puVar8 = puVar8 + 1;
    }
    n_seg = (uint32 *)CONCAT44(n_seg._4_4_,(int)uVar10);
    iVar1 = __isoc99_fscanf(pFVar7,"%u");
    if (iVar1 == -1) {
      fclose(pFVar7);
      uVar2 = feat->n_sv;
      if (uVar2 == 0) {
        uVar2 = feat->n_stream;
      }
      if (feat->lda == (mfcc_t ***)0x0) {
        puVar8 = feat->sv_len;
        if (puVar8 == (uint32 *)0x0) {
          puVar8 = feat->stream_len;
        }
      }
      else {
        puVar8 = &feat->out_dim;
      }
      sVar3 = SEGDMP_TYPE_VQ;
      iVar1 = segdmp_open_write(local_48,local_50,local_58,local_60,puVar9,(uint32 **)0x0,
                                in_stack_ffffffffffffff48,uVar2,puVar8,feat->out_dim);
      if (iVar1 == 0) {
        iVar1 = agg_st_seg(mdef,local_88,feat,ts2cb,cb2mllr,sVar3);
LAB_0010557f:
        if (iVar1 == 0) {
          segdmp_close();
          return 0;
        }
        goto LAB_001057b7;
      }
      pcVar5 = "Unable to initialize segment dump\n";
      lVar6 = 0x1c1;
    }
    else {
      pcVar5 = "Expected EOF on count file, but remaining data found\n";
      lVar6 = 0x146;
    }
  }
  else {
    iVar1 = strcmp(pcVar5,"phn");
    if (iVar1 == 0) {
      pcVar4 = cmd_ln_get();
      lVar6 = cmd_ln_int_r(pcVar4,"-cachesz");
      segdmp_set_bufsz((uint32)lVar6);
      plVar11 = lex;
      mdef_00 = mdef;
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      pFVar7 = fopen(pcVar5,"r");
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      if (pFVar7 == (FILE *)0x0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                ,0x15d,"Count file %s not found; creating.\n",pcVar5);
        cnt_phn_seg(mdef_00,plVar11,&n_seg,&local_68);
        pcVar4 = cmd_ln_get();
        pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                ,0x160,"Writing %s.\n",pcVar5);
        pcVar4 = cmd_ln_get();
        pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
        pFVar7 = fopen(pcVar5,"w");
        for (uVar10 = 0; uVar2 = acmod_set_n_acmod(mdef_00->acmod_set), uVar10 < uVar2;
            uVar10 = uVar10 + 1) {
          fprintf(pFVar7,"%u",(ulong)n_seg[uVar10]);
          for (uVar13 = 0; uVar13 < n_seg[uVar10]; uVar13 = uVar13 + 1) {
            fprintf(pFVar7," %u",(ulong)local_68[uVar10][uVar13]);
          }
          fputc(10,pFVar7);
        }
        goto LAB_0010594f;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
              ,0x16f,"Reading %s\n",pcVar5);
      uVar2 = acmod_set_n_acmod(mdef_00->acmod_set);
      plVar11 = (lexicon_t *)(ulong)uVar2;
      puVar8 = (uint32 *)
               __ckd_calloc__((size_t)plVar11,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                              ,0x173);
      n_seg = puVar8;
      local_88 = plVar11;
      local_68 = (uint32 **)
                 __ckd_calloc__((size_t)plVar11,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                                ,0x174);
      in_n_frame = local_68;
      for (plVar11 = (lexicon_t *)0x0; local_5c = SUB84(plVar11,0), plVar11 != local_88;
          plVar11 = (lexicon_t *)((long)&plVar11->entry_cnt + 1)) {
        iVar1 = __isoc99_fscanf(pFVar7,"%u",puVar8 + (long)plVar11);
        if (iVar1 != 1) {
          pcVar4 = cmd_ln_get();
          pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
          lVar6 = 0x179;
          goto LAB_001057ad;
        }
        uVar10 = (ulong)puVar8[(long)plVar11];
        ppuVar12 = in_n_frame;
        if (uVar10 != 0) {
          puVar9 = (uint32 *)
                   __ckd_calloc__(uVar10,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                                  ,0x17d);
          ppuVar12 = local_68;
          puVar8 = n_seg;
          in_n_frame[(long)plVar11] = puVar9;
          uVar10 = 0xffffffffffffffff;
          lVar6 = 0;
          while (uVar10 = uVar10 + 1, uVar10 < puVar8[(long)plVar11]) {
            iVar1 = __isoc99_fscanf(pFVar7,"%u",lVar6 + (long)ppuVar12[(long)plVar11]);
            lVar6 = lVar6 + 4;
            if (iVar1 != 1) {
              pcVar4 = cmd_ln_get();
              pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
              lVar6 = 0x182;
              goto LAB_001057ad;
            }
          }
        }
        in_n_frame = ppuVar12;
      }
      iVar1 = __isoc99_fscanf(pFVar7,"%u",&local_5c);
      if (iVar1 == -1) {
        fclose(pFVar7);
        pcVar4 = cmd_ln_get();
        dirs = cmd_ln_str_list_r(pcVar4,"-segdmpdirs");
        pcVar4 = cmd_ln_get();
        pcVar5 = cmd_ln_str_r(pcVar4,"-segdmpfn");
        pcVar4 = cmd_ln_get();
        ifn = cmd_ln_str_r(pcVar4,"-segidxfn");
        sVar3 = acmod_set_n_acmod(mdef->acmod_set);
        uVar2 = feat->n_sv;
        if (uVar2 == 0) {
          uVar2 = feat->n_stream;
        }
        if (feat->lda == (mfcc_t ***)0x0) {
          puVar9 = feat->sv_len;
          if (puVar9 == (uint32 *)0x0) {
            puVar9 = feat->stream_len;
          }
        }
        else {
          puVar9 = &feat->out_dim;
        }
        iVar1 = segdmp_open_write(dirs,pcVar5,ifn,sVar3,puVar8,in_n_frame,in_stack_ffffffffffffff48,
                                  uVar2,puVar9,feat->out_dim);
        if (iVar1 == 0) {
          iVar1 = agg_phn_seg(lex,mdef->acmod_set,feat,sVar3);
          goto LAB_0010557f;
        }
        pcVar5 = "Unable to initialize segment dump\n";
        lVar6 = 0x1d9;
      }
      else {
        pcVar5 = "Expected EOF on count file, but remaining data found\n";
        lVar6 = 0x189;
      }
    }
    else {
      iVar1 = strcmp(pcVar5,"wrd");
      if (iVar1 == 0) {
        pcVar5 = "Unimplememented -segtype wrd\n";
        lVar6 = 0x1e3;
      }
      else {
        iVar1 = strcmp(pcVar5,"utt");
        if (iVar1 != 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                  ,0x1e9,"Unhandled -segtype %s\n",pcVar5);
          goto LAB_001057b7;
        }
        pcVar5 = "Unimplememented -segtype utt\n";
        lVar6 = 0x1e6;
      }
    }
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
          ,lVar6,pcVar5);
LAB_001057b7:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
    lexicon_t *lex;
    model_def_t *mdef;
    feat_t *feat;
    const char *segtype;
    segdmp_type_t dmp_type;
    uint32 *n_seg;
    uint32 **n_frame;
    uint32 *ts2cb;
    int32 *cb2mllr;
    /*eov*/

    parse_cmd_ln(argc, argv);

    if (initialize(&lex, &mdef, &feat, &ts2cb, &cb2mllr, &dmp_type) != S3_SUCCESS) {
	exit(1);
    }

    segtype = cmd_ln_str("-segtype");

    if (strcmp(segtype, "all") == 0) {
	E_INFO("Writing frames to one file\n");

	if (agg_all_seg(feat,
			dmp_type,
			cmd_ln_str("-segdmpfn"),
			cmd_ln_int32("-stride")) != S3_SUCCESS) {
	    exit(1);
	}
    }
    else if (strcmp(segtype, "st") == 0) {
	segdmp_set_bufsz(cmd_ln_int32("-cachesz"));
	
	if (segdmp_open_write(cmd_ln_str_list("-segdmpdirs"),
			      cmd_ln_str("-segdmpfn"),
			      cmd_ln_str("-segidxfn"),
			      mdef->n_tied_state,
			      cnt_st(mdef, lex),
			      NULL,
			      dmp_type,
			      feat_dimension1(feat),
			      feat_stream_lengths(feat),
			      feat_dimension(feat)) != S3_SUCCESS) {
	    E_FATAL("Unable to initialize segment dump\n");
	}
	
	if (agg_st_seg(mdef, lex, feat, ts2cb, cb2mllr, dmp_type) != S3_SUCCESS) {
	    exit(1);
	}
	
	segdmp_close();
    }
    else if (strcmp(segtype, "phn") == 0) {
	segdmp_set_bufsz(cmd_ln_int32("-cachesz"));
	
	cnt_phn(mdef, lex, &n_seg, &n_frame);

	if (segdmp_open_write(cmd_ln_str_list("-segdmpdirs"),
			      cmd_ln_str("-segdmpfn"),
			      cmd_ln_str("-segidxfn"),
			      acmod_set_n_acmod(mdef->acmod_set),
			      n_seg,
			      n_frame,
			      dmp_type,
			      feat_dimension1(feat),
			      feat_stream_lengths(feat),
			      feat_dimension(feat)) != S3_SUCCESS) {
	    E_FATAL("Unable to initialize segment dump\n");
	}
	
	if (agg_phn_seg(lex, mdef->acmod_set, feat, dmp_type) != S3_SUCCESS) {
	    exit(1);
	}
	
	segdmp_close();
    }
    else if (strcmp(segtype, "wrd") == 0) {
	E_FATAL("Unimplememented -segtype wrd\n");
    }
    else if (strcmp(segtype, "utt") == 0) {
	E_FATAL("Unimplememented -segtype utt\n");
    }
    else {
	E_FATAL("Unhandled -segtype %s\n", segtype);
    }

    return 0;
}